

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O0

SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *
Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::New
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *bucket)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *pHVar4;
  size_t sVar5;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *this;
  TrackAllocData local_40;
  HeapBlockType local_15;
  ushort local_14;
  ushort local_12;
  HeapBlockType blockType;
  ushort objectCount;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *pHStack_10
  ;
  ushort objectSize;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *bucket_local;
  
  pHStack_10 = bucket;
  if (0x300 < (bucket->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0x1d,"(bucket->sizeCat <= TBlockAttributes::MaxObjectSize)",
                       "bucket->sizeCat <= TBlockAttributes::MaxObjectSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (0xffff < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) /
                      ZEXT416((pHStack_10->super_HeapBucket).sizeCat),0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0x1e,
                       "((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= (32767 * 2 + 1))"
                       ,
                       "(TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_12 = (ushort)(pHStack_10->super_HeapBucket).sizeCat;
  local_14 = SUB162((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT216(local_12),0);
  local_15 = SmallNormalBlockWithBarrierType;
  pHVar4 = HeapAllocator::GetNoMemProtectInstance();
  sVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize((uint)local_14);
  TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,sVar5,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
             ,0x24);
  pHVar4 = HeapAllocator::TrackAllocInfo(pHVar4,&local_40);
  sVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAllocPlusSize((uint)local_14);
  this = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
         new<Memory::HeapAllocator>(0x110,pHVar4,true,0x8e2230,0,SUB81(sVar5,0));
  SmallNormalWithBarrierHeapBlockT(this,&pHStack_10->super_HeapBucket,local_12,local_14,local_15);
  return this;
}

Assistant:

SmallNormalWithBarrierHeapBlockT<TBlockAttributes> *
SmallNormalWithBarrierHeapBlockT<TBlockAttributes>::New(HeapBucketT<SmallNormalWithBarrierHeapBlockT<TBlockAttributes>> * bucket)
{
    CompileAssert(TBlockAttributes::MaxObjectSize <= USHRT_MAX);
    Assert(bucket->sizeCat <= TBlockAttributes::MaxObjectSize);
    Assert((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX);

    ushort objectSize = (ushort)bucket->sizeCat;
    ushort objectCount = (ushort)((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / objectSize);

    HeapBlockType blockType = (TBlockAttributes::IsSmallBlock ? HeapBlock::SmallNormalBlockWithBarrierType : HeapBlock::MediumNormalBlockWithBarrierType);
    return NoMemProtectHeapNewNoThrowPlusPrefixZ(Base::GetAllocPlusSize(objectCount), SmallNormalWithBarrierHeapBlockT<TBlockAttributes>, bucket, objectSize, objectCount, blockType);
}